

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O3

_Bool intersect_tri3_sphere(vec3_t v0,vec3_t v1,vec3_t v2,vec3_t center,float radius)

{
  segment3_t seg;
  segment3_t seg_00;
  segment3_t seg_01;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  vec3_t vVar8;
  segment3_t s_2;
  segment3_t s_1;
  segment3_t s;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 local_88;
  undefined4 uStack_84;
  
  fVar1 = v0.z;
  vVar8 = tri3_get_point_barycentric_coordinates(v0,v1,v2,center);
  local_88 = v0.x;
  uStack_84 = v0.y;
  local_a8 = v1.x;
  uStack_a4 = v1.y;
  local_98 = v2.x;
  uStack_94 = v2.y;
  if ((((vVar8.x < 0.0) || (1.0 < vVar8.x)) || (vVar8.y < 0.0)) ||
     (((1.0 < vVar8.y || (vVar8.z < 0.0)) || (1.0 < vVar8.z)))) {
    seg.e.x = local_a8;
    seg.s.z = fVar1;
    seg.s.x = (float)(int)v0._0_8_;
    seg.s.y = (float)(int)((ulong)v0._0_8_ >> 0x20);
    seg.e.y = (float)(int)v1._4_8_;
    seg.e.z = (float)(int)((ulong)v1._4_8_ >> 0x20);
    fVar4 = distance_to_segment3(seg,center);
    seg_00.e.x = local_98;
    seg_00.s.z = v1.z;
    seg_00.s.x = (float)(int)v1._0_8_;
    seg_00.s.y = (float)(int)((ulong)v1._0_8_ >> 0x20);
    seg_00.e.y = (float)(int)v2._4_8_;
    seg_00.e.z = (float)(int)((ulong)v2._4_8_ >> 0x20);
    fVar1 = distance_to_segment3(seg_00,center);
    seg_01.e.x = local_88;
    seg_01.s.z = v2.z;
    seg_01.s.x = (float)(int)v2._0_8_;
    seg_01.s.y = (float)(int)((ulong)v2._0_8_ >> 0x20);
    seg_01.e.y = (float)(int)v0._4_8_;
    seg_01.e.z = (float)(int)((ulong)v0._4_8_ >> 0x20);
    fVar2 = distance_to_segment3(seg_01,center);
    if (fVar2 <= fVar1) {
      fVar1 = fVar2;
    }
    if (fVar1 <= fVar4) {
      fVar4 = fVar1;
    }
  }
  else {
    fVar6 = v1.z - fVar1;
    fVar4 = v2.z - fVar1;
    fVar2 = (uStack_a4 - uStack_84) * fVar4 - fVar6 * (uStack_94 - uStack_84);
    fVar7 = fVar6 * (local_98 - local_88) - fVar4 * (local_a8 - local_88);
    fVar4 = (uStack_94 - uStack_84) * (local_a8 - local_88) -
            (local_98 - local_88) * (uStack_a4 - uStack_84);
    fVar6 = SQRT(fVar4 * fVar4 + fVar2 * fVar2 + fVar7 * fVar7);
    fVar2 = fVar2 / fVar6;
    fVar7 = fVar7 / fVar6;
    fVar4 = fVar4 / fVar6;
    fVar6 = SQRT(fVar4 * fVar4 + fVar2 * fVar2 + fVar7 * fVar7);
    fVar3 = fVar2 / fVar6;
    fVar5 = fVar7 / fVar6;
    fVar6 = fVar4 / fVar6;
    local_c8 = center.x;
    uStack_c4 = center.y;
    fVar4 = (fVar6 * center.z + fVar3 * local_c8 + fVar5 * uStack_c4) -
            (fVar4 * fVar1 + fVar2 * local_88 + fVar7 * uStack_84);
    fVar1 = -fVar4;
    if (-fVar4 <= fVar4) {
      fVar1 = fVar4;
    }
    fVar4 = fVar1 / (fVar6 * fVar6 + fVar3 * fVar3 + fVar5 * fVar5);
  }
  return fVar4 <= radius;
}

Assistant:

bool
intersect_tri3_sphere(vec3_t v0, vec3_t v1, vec3_t v2, vec3_t center, float radius) {
    vec3_t  uvw = tri3_get_point_barycentric_coordinates(v0, v1, v2, center);
    if( is_in_0_1_range(uvw.x) && is_in_0_1_range(uvw.y) && is_in_0_1_range(uvw.z) ) {
        plane_t p   = tri3_plane(v0, v1, v2);
        if( distance_to_plane(p, center) <= radius ) {
            return true;
        } else {
            return false;
        }
    } else {    // point is outside, check the distance from center to segments
        float   d0  = distance_to_segment3(segment3(v0, v1), center);
        float   d1  = distance_to_segment3(segment3(v1, v2), center);
        float   d2  = distance_to_segment3(segment3(v2, v0), center);
        float   m   = MIN(d0, MIN(d1, d2));
        if( m <= radius ) {
            return true;
        } else {
            return false;
        }
    }
}